

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-process-title.c
# Opt level: O1

int run_test_process_title(void)

{
  int iVar1;
  int extraout_EAX;
  uint uVar2;
  int extraout_EAX_00;
  uv_loop_t *loop;
  uv_loop_t *loop_00;
  int extraout_EDX;
  undefined8 unaff_RBP;
  uv_process_t *process;
  char *pcVar3;
  char *pcVar4;
  char *title;
  uv_handle_t *handle;
  uv_handle_t auStack_c58 [2];
  uv_loop_t *puStack_b50;
  code *pcStack_b48;
  code *pcStack_b40;
  undefined1 auStack_b30 [24];
  uv_close_cb p_Stack_b18;
  uv_close_cb p_Stack_b10;
  void *pvStack_b08;
  undefined1 auStack_af8 [48];
  uv_stdio_container_t *puStack_ac8;
  void *pvStack_ac0;
  uv_process_t uStack_ab0;
  undefined1 auStack_a28 [511];
  undefined1 uStack_829;
  uv_loop_t uStack_828;
  char *pcStack_428;
  char acStack_410 [512];
  char acStack_208 [520];
  
  pcVar4 = acStack_208;
  title = acStack_208;
  set_title("%s%s%s%s%s%s%s%s%s%s%s%s%s%s%s%s%s%s%s");
  set_title("new title");
  pcVar3 = (char *)0x0;
  iVar1 = uv_get_process_title((char *)0x0,100);
  if (iVar1 == -0x16) {
    iVar1 = uv_get_process_title(acStack_208,0);
    pcVar3 = pcVar4;
    if (iVar1 != -0x16) goto LAB_00165cd0;
    iVar1 = uv_get_process_title(acStack_208,1);
    if (iVar1 == -0x69) {
      return 0;
    }
  }
  else {
    run_test_process_title_cold_1();
LAB_00165cd0:
    title = pcVar3;
    run_test_process_title_cold_2();
  }
  run_test_process_title_cold_3();
  iVar1 = uv_get_process_title(acStack_410,0x200);
  if (iVar1 == 0) {
    iVar1 = uv_set_process_title(title);
    if (iVar1 != 0) goto LAB_00165d30;
    iVar1 = uv_get_process_title(acStack_410,0x200);
    if (iVar1 != 0) goto LAB_00165d35;
    iVar1 = strcmp(acStack_410,title);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    set_title_cold_1();
LAB_00165d30:
    set_title_cold_2();
LAB_00165d35:
    set_title_cold_3();
  }
  set_title_cold_4();
  process = (uv_process_t *)auStack_b30;
  auStack_b30._0_8_ = (void *)0x3ff;
  loop_00 = &uStack_828;
  pcStack_b40 = (code *)0x165d66;
  loop = loop_00;
  pcStack_428 = title;
  iVar1 = uv_exepath((char *)loop_00,(size_t *)process);
  if (iVar1 == 0) {
    unaff_RBP = 0;
    *(undefined1 *)(auStack_b30._0_8_ + (long)(uStack_828.handle_queue + -2)) = 0;
    pcStack_b40 = (code *)0x165d97;
    memset(auStack_a28,0x78,0x1ff);
    uStack_829 = 0;
    auStack_af8._16_8_ = auStack_b30 + 8;
    auStack_b30._16_8_ = "process_title_big_argv_helper";
    pvStack_b08 = (void *)0x0;
    auStack_af8._24_8_ = (uv_handle_t *)0x0;
    auStack_af8._32_8_ = (char *)0x0;
    auStack_af8._40_8_ = (uv_exit_cb)0x0;
    puStack_ac8 = (uv_stdio_container_t *)0x0;
    pvStack_ac0 = (void *)0x0;
    auStack_af8._0_8_ = exit_cb;
    pcStack_b40 = (code *)0x165df3;
    auStack_b30._8_8_ = loop_00;
    p_Stack_b18 = (uv_close_cb)auStack_a28;
    p_Stack_b10 = (uv_close_cb)auStack_a28;
    auStack_af8._8_8_ = loop_00;
    loop = uv_default_loop();
    process = &uStack_ab0;
    pcStack_b40 = (code *)0x165e06;
    iVar1 = uv_spawn(loop,process,(uv_process_options_t *)auStack_af8);
    if (iVar1 != 0) goto LAB_00165e64;
    pcStack_b40 = (code *)0x165e0f;
    loop = uv_default_loop();
    process = (uv_process_t *)0x0;
    pcStack_b40 = (code *)0x165e19;
    iVar1 = uv_run(loop,UV_RUN_DEFAULT);
    if (iVar1 == 0) {
      pcStack_b40 = (code *)0x165e22;
      loop_00 = uv_default_loop();
      pcStack_b40 = (code *)0x165e36;
      uv_walk(loop_00,close_walk_cb,(void *)0x0);
      process = (uv_process_t *)0x0;
      pcStack_b40 = (code *)0x165e40;
      uv_run(loop_00,UV_RUN_DEFAULT);
      pcStack_b40 = (code *)0x165e45;
      loop = uv_default_loop();
      pcStack_b40 = (code *)0x165e4d;
      iVar1 = uv_loop_close(loop);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_00165e6e;
    }
  }
  else {
    pcStack_b40 = (code *)0x165e64;
    run_test_process_title_big_argv_cold_1();
LAB_00165e64:
    pcStack_b40 = (code *)0x165e69;
    run_test_process_title_big_argv_cold_2();
  }
  pcStack_b40 = (code *)0x165e6e;
  run_test_process_title_big_argv_cold_3();
LAB_00165e6e:
  pcStack_b40 = exit_cb;
  run_test_process_title_big_argv_cold_4();
  if (process == (uv_process_t *)0x0) {
    if (extraout_EDX == 0) {
      uv_close((uv_handle_t *)loop,(uv_close_cb)0x0);
      return extraout_EAX;
    }
  }
  else {
    pcStack_b48 = (code *)0x165e8a;
    exit_cb_cold_1();
  }
  pcStack_b48 = process_title_big_argv;
  exit_cb_cold_2();
  handle = auStack_c58;
  puStack_b50 = loop_00;
  pcStack_b48 = (code *)unaff_RBP;
  memset(auStack_c58,0,0x100);
  auStack_c58[0].data._0_4_ = 0x6c696166;
  uv_get_process_title((char *)auStack_c58,0x100);
  uVar2 = (uint)auStack_c58[0].data._4_1_ | (uint)auStack_c58[0].data ^ 0x6c696166;
  if (uVar2 != 0) {
    return uVar2;
  }
  process_title_big_argv_cold_1();
  iVar1 = uv_is_closing(handle);
  if (iVar1 != 0) {
    return iVar1;
  }
  uv_close(handle,(uv_close_cb)0x0);
  return extraout_EAX_00;
}

Assistant:

TEST_IMPL(process_title) {
#if defined(__sun) || defined(__CYGWIN__) || defined(__MSYS__) || \
    defined(__PASE__)
  RETURN_SKIP("uv_(get|set)_process_title is not implemented.");
#endif

  /* Check for format string vulnerabilities. */
  set_title("%s%s%s%s%s%s%s%s%s%s%s%s%s%s%s%s%s%s%s");
  set_title("new title");

  /* Check uv_get_process_title() edge cases */
  uv_get_process_title_edge_cases();

  return 0;
}